

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

array<float,_2>
pbrt::Checkerboard(AAMethod aaMethod,TextureEvalContext ctx,TextureMapping2DHandle *map2D,
                  TextureMapping3DHandle *map3D)

{
  float fVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  ulong uVar5;
  byte bVar6;
  anon_class_24_3_48d30edf func;
  TransformMapping3D *ptr;
  uint uVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar13 [56];
  undefined1 auVar12 [64];
  undefined1 auVar14 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar16 [60];
  undefined1 auVar15 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Point3f PVar19;
  initializer_list<float> v;
  array<float,_2> local_c8;
  float local_c0;
  float local_bc;
  Float local_b8;
  Float local_b4;
  Tuple2<pbrt::Vector2,_float> local_b0;
  undefined8 ***local_a8;
  Tuple3<pbrt::Point3,_float> *local_a0;
  undefined8 ***pppuStack_98;
  Tuple2<pbrt::Vector2,_float> *local_90;
  undefined1 local_88 [16];
  Tuple2<pbrt::Vector2,_float> local_78;
  undefined4 local_70;
  undefined8 ***local_68;
  undefined4 local_60;
  Tuple3<pbrt::Point3,_float> local_58 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_40 [3];
  int iStack_1c;
  undefined1 local_18 [16];
  undefined1 extraout_var [56];
  
  ptr = (TransformMapping3D *)
        ((map3D->super_TaggedPointer<pbrt::TransformMapping3D>).bits & 0xffffffffffff);
  if (((map2D->
       super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
       ).bits & 0xffffffffffff) == 0) {
    if (ptr == (TransformMapping3D *)0x0) {
      LogFatal<char_const(&)[6]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/textures.cpp"
                 ,0xd0,"Check failed: %s",(char (*) [6])0x494752);
    }
    local_a8 = &local_68;
    local_b0 = (Tuple2<pbrt::Vector2,_float>)&local_78;
    pppuStack_98 = &local_a8;
    local_a0 = local_58;
    local_68 = (undefined8 ****)0x0;
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_60 = 0;
    local_70 = 0;
    local_90 = &local_b0;
    local_58[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
    local_58[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
    local_58[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
    local_58[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
    local_58[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
    local_58[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_40[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
    aTStack_40[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
    aTStack_40[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_40[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
    aTStack_40[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
    aTStack_40[1].z = ctx.dudx;
    aTStack_40[2].x = ctx.dudy;
    aTStack_40[2].y = ctx.dvdx;
    aTStack_40[2].z = ctx.dvdy;
    iStack_1c = ctx.faceIndex;
    auVar13 = ZEXT856((ulong)ctx._8_8_);
    auVar16 = ZEXT1260(in_ZMM1._4_12_);
    PVar19 = const::{lambda(auto:1)#1}::operator()((_lambda_auto_1__1_ *)&local_a0,ptr);
    auVar15._0_4_ = PVar19.super_Tuple3<pbrt::Point3,_float>.z;
    auVar15._4_60_ = auVar16;
    auVar12._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar12._8_56_ = auVar13;
    auVar9 = auVar12._0_16_;
    auVar14 = vroundss_avx(auVar9,auVar9,9);
    auVar9 = vmovshdup_avx(auVar9);
    auVar9 = vroundss_avx(auVar9,auVar9,9);
    auVar17 = vroundss_avx(auVar15._0_16_,auVar15._0_16_,9);
    uVar7 = (int)auVar17._0_4_ + (int)auVar14._0_4_ + (int)auVar9._0_4_;
joined_r0x002d2066:
    if ((uVar7 & 1) == 0) {
LAB_002d206c:
      local_58[0]._0_8_ = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
      goto LAB_002d21a5;
    }
  }
  else {
    if (ptr != (TransformMapping3D *)0x0) {
      LogFatal<char_const(&)[7]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/textures.cpp"
                 ,0xab,"Check failed: %s",(char (*) [7])"!map3D");
    }
    local_68 = &local_a8;
    pppuStack_98 = &local_68;
    local_a0 = local_58;
    local_78 = (Tuple2<pbrt::Vector2,_float>)&local_b0;
    local_a8 = (undefined8 ****)0x0;
    local_90 = &local_78;
    local_b0.x = 0.0;
    local_b0.y = 0.0;
    local_58[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
    local_58[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
    local_58[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
    local_58[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
    local_58[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
    local_58[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_40[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
    aTStack_40[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
    aTStack_40[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_40[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
    aTStack_40[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
    aTStack_40[1].z = ctx.dudx;
    aTStack_40[2].x = ctx.dudy;
    aTStack_40[2].y = ctx.dvdx;
    aTStack_40[2].z = ctx.dvdy;
    iStack_1c = ctx.faceIndex;
    func.dstdx = (Vector2f **)pppuStack_98;
    func.ctx = (TextureEvalContext *)local_a0;
    func.dstdy = (Vector2f **)local_90;
    auVar11._0_8_ =
         TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
         ::
         Dispatch<pbrt::TextureMapping2DHandle::Map(pbrt::TextureEvalContext,pbrt::Vector2<float>*,pbrt::Vector2<float>*)const::_lambda(auto:1)_1_>
                   ((TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                     *)map2D,func);
    auVar11._8_56_ = extraout_var;
    auVar9 = auVar11._0_16_;
    if (aaMethod != None) {
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_a8;
      auVar17._8_4_ = 0x7fffffff;
      auVar17._0_8_ = 0x7fffffff7fffffff;
      auVar17._12_4_ = 0x7fffffff;
      auVar18._8_8_ = 0;
      auVar18._0_4_ = local_b0.x;
      auVar18._4_4_ = local_b0.y;
      auVar14 = vandps_avx(auVar14,auVar17);
      auVar17 = vandps_avx(auVar18,auVar17);
      auVar14 = vmaxps_avx(auVar17,auVar14);
      auVar17 = vmovshdup_avx(auVar9);
      fVar3 = auVar11._0_4_ - auVar14._0_4_;
      fVar8 = auVar11._0_4_ + auVar14._0_4_;
      auVar18 = vmovshdup_avx(auVar14);
      fVar4 = auVar17._0_4_ - auVar18._0_4_;
      fVar1 = auVar17._0_4_ + auVar18._0_4_;
      auVar2 = vroundss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),9);
      auVar10 = vroundss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8),9);
      if ((auVar2._0_4_ == auVar10._0_4_) && (!NAN(auVar2._0_4_) && !NAN(auVar10._0_4_))) {
        auVar2 = vroundss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),9);
        auVar10 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
        if ((auVar2._0_4_ == auVar10._0_4_) && (!NAN(auVar2._0_4_) && !NAN(auVar10._0_4_))) {
          auVar9 = vroundss_avx(auVar9,auVar9,9);
          auVar14 = vroundss_avx(auVar17,auVar17,9);
          uVar7 = (int)auVar14._0_4_ + (int)auVar9._0_4_;
          goto joined_r0x002d2066;
        }
      }
      local_c0 = fVar1;
      local_b8 = fVar3;
      local_b4 = fVar4;
      local_88 = auVar14;
      local_18 = auVar18;
      local_bc = Checkerboard::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)map2D,fVar8);
      fVar8 = Checkerboard::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)map2D,local_b8);
      local_bc = (local_bc - fVar8) / ((float)local_88._0_4_ + (float)local_88._0_4_);
      local_c0 = Checkerboard::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)map2D,local_c0);
      fVar8 = Checkerboard::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)map2D,local_b4);
      auVar9._0_4_ = (local_c0 - fVar8) / ((float)local_18._0_4_ + (float)local_18._0_4_);
      auVar9._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar9 = vfmadd213ss_fma(ZEXT416((uint)(local_bc * -2.0)),auVar9,
                               ZEXT416((uint)(local_bc + auVar9._0_4_)));
      auVar2._8_4_ = 0x3f800000;
      auVar2._0_8_ = 0x3f8000003f800000;
      auVar2._12_4_ = 0x3f800000;
      uVar5 = vcmpps_avx512vl(local_88,auVar2,0xe);
      bVar6 = (byte)(uVar5 >> 1);
      local_58[0].y =
           (float)((uint)((byte)uVar5 & 1) * 0x3f000000 +
                  (uint)!(bool)((byte)uVar5 & 1) *
                  ((uint)(bVar6 & 1) * 0x3f000000 + (uint)!(bool)(bVar6 & 1) * auVar9._0_4_));
      local_58[0].x = 1.0 - local_58[0].y;
      goto LAB_002d21a5;
    }
    auVar9 = vroundps_avx(auVar9,9);
    auVar10._0_4_ = (int)auVar9._0_4_;
    auVar10._4_4_ = (int)auVar9._4_4_;
    auVar10._8_4_ = (int)auVar9._8_4_;
    auVar10._12_4_ = (int)auVar9._12_4_;
    auVar9 = vphaddd_avx(auVar10,auVar10);
    if ((auVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_002d206c;
  }
  local_58[0].x = 0.0;
  local_58[0].y = 1.0;
LAB_002d21a5:
  v._M_array = local_58;
  v._M_len = 2;
  pstd::array<float,_2>::array(&local_c8,v);
  return (array<float,_2>)local_c8.values;
}

Assistant:

pstd::array<Float, 2> Checkerboard(AAMethod aaMethod, TextureEvalContext ctx,
                                   const TextureMapping2DHandle map2D,
                                   const TextureMapping3DHandle map3D) {
    if (map2D) {
        CHECK(!map3D);
        Vector2f dstdx, dstdy;
        Point2f st = map2D.Map(ctx, &dstdx, &dstdy);
        if (aaMethod == AAMethod::None) {
            // Point sample _Checkerboard2DTexture_
            if (((int)std::floor(st[0]) + (int)std::floor(st[1])) % 2 == 0)
                return {Float(1), Float(0)};
            return {Float(0), Float(1)};
        } else {
            // Compute closed-form box-filtered _Checkerboard2DTexture_ value

            // Evaluate single check if filter is entirely inside one of them
            Float ds = std::max(std::abs(dstdx[0]), std::abs(dstdy[0]));
            Float dt = std::max(std::abs(dstdx[1]), std::abs(dstdy[1]));
            Float s0 = st[0] - ds, s1 = st[0] + ds;
            Float t0 = st[1] - dt, t1 = st[1] + dt;
            if (std::floor(s0) == std::floor(s1) && std::floor(t0) == std::floor(t1)) {
                // Point sample _Checkerboard2DTexture_
                if (((int)std::floor(st[0]) + (int)std::floor(st[1])) % 2 == 0)
                    return {Float(1), Float(0)};
                return {Float(0), Float(1)};
            }

            // Apply box filter to checkerboard region
            auto bumpInt = [](Float x) {
                return (int)std::floor(x / 2) +
                       2 * std::max(x / 2 - (int)std::floor(x / 2) - (Float)0.5,
                                    (Float)0);
            };
            Float sint = (bumpInt(s1) - bumpInt(s0)) / (2 * ds);
            Float tint = (bumpInt(t1) - bumpInt(t0)) / (2 * dt);
            Float area2 = sint + tint - 2 * sint * tint;
            if (ds > 1 || dt > 1)
                area2 = .5f;
            return {(1 - area2), area2};
        }
    } else {
        CHECK(map3D);
        Vector3f dpdx, dpdy;
        Point3f p = map3D.Map(ctx, &dpdx, &dpdy);
        if (((int)std::floor(p.x) + (int)std::floor(p.y) + (int)std::floor(p.z)) % 2 == 0)
            return {Float(1), Float(0)};
        return {Float(0), Float(1)};
    }
}